

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::LSTMParams::ByteSizeLong(LSTMParams *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (this->cellclipthreshold_ != 0.0) {
    sVar1 = 6;
  }
  if (NAN(this->cellclipthreshold_)) {
    sVar1 = 6;
  }
  sVar2 = sVar1 + 2;
  if (this->sequenceoutput_ == false) {
    sVar2 = sVar1;
  }
  sVar1 = sVar2 + 3;
  if (this->hasbiasvectors_ == false) {
    sVar1 = sVar2;
  }
  sVar2 = sVar1 + 3;
  if (this->forgetbias_ == false) {
    sVar2 = sVar1;
  }
  sVar1 = sVar2 + 3;
  if (this->haspeepholevectors_ == false) {
    sVar1 = sVar2;
  }
  sVar2 = sVar1 + 3;
  if (this->coupledinputandforgetgate_ == false) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t LSTMParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LSTMParams)
  size_t total_size = 0;

  // float cellClipThreshold = 60;
  if (this->cellclipthreshold() != 0) {
    total_size += 2 + 4;
  }

  // bool sequenceOutput = 10;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool forgetBias = 30;
  if (this->forgetbias() != 0) {
    total_size += 2 + 1;
  }

  // bool hasPeepholeVectors = 40;
  if (this->haspeepholevectors() != 0) {
    total_size += 2 + 1;
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->coupledinputandforgetgate() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}